

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::WriteBufferToSink
          (anon_unknown_0 *this,char sign_char,string_view str,FormatConversionSpecImpl *conv,
          FormatSinkImpl *sink)

{
  char c;
  string_view v;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  FormatConversionSpecImpl *this_00;
  undefined7 in_register_00000031;
  size_t existing_chars;
  size_t conv_width_size_t;
  size_t missing_chars;
  size_t right_spaces;
  size_t zeros;
  size_t left_spaces;
  FormatSinkImpl *sink_local;
  FormatConversionSpecImpl *conv_local;
  undefined1 auStack_18 [7];
  char sign_char_local;
  string_view str_local;
  
  _auStack_18 = CONCAT71(in_register_00000031,sign_char);
  this_00 = (FormatConversionSpecImpl *)str._M_str;
  str_local._M_len = str._M_len;
  c = (char)this;
  zeros = 0;
  right_spaces = 0;
  missing_chars = 0;
  conv_width_size_t = 0;
  iVar2 = FormatConversionSpecImpl::width(this_00);
  if (-1 < iVar2) {
    iVar2 = FormatConversionSpecImpl::width(this_00);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
    uVar4 = sVar3 + (c != '\0');
    if (uVar4 < (ulong)(long)iVar2) {
      conv_width_size_t = (long)iVar2 - uVar4;
    }
  }
  bVar1 = FormatConversionSpecImpl::has_left_flag(this_00);
  if (bVar1) {
    missing_chars = conv_width_size_t;
  }
  else {
    bVar1 = FormatConversionSpecImpl::has_zero_flag(this_00);
    if (bVar1) {
      right_spaces = conv_width_size_t;
    }
    else {
      zeros = conv_width_size_t;
    }
  }
  FormatSinkImpl::Append((FormatSinkImpl *)conv,zeros,' ');
  if (c != '\0') {
    FormatSinkImpl::Append((FormatSinkImpl *)conv,1,c);
  }
  FormatSinkImpl::Append((FormatSinkImpl *)conv,right_spaces,'0');
  v._M_str = (char *)str_local._M_len;
  v._M_len = _auStack_18;
  FormatSinkImpl::Append((FormatSinkImpl *)conv,v);
  FormatSinkImpl::Append((FormatSinkImpl *)conv,missing_chars,' ');
  return;
}

Assistant:

void WriteBufferToSink(char sign_char, absl::string_view str,
                       const FormatConversionSpecImpl &conv,
                       FormatSinkImpl *sink) {
  size_t left_spaces = 0, zeros = 0, right_spaces = 0;
  size_t missing_chars = 0;
  if (conv.width() >= 0) {
    const size_t conv_width_size_t = static_cast<size_t>(conv.width());
    const size_t existing_chars =
        str.size() + static_cast<size_t>(sign_char != 0);
    if (conv_width_size_t > existing_chars)
      missing_chars = conv_width_size_t - existing_chars;
  }
  if (conv.has_left_flag()) {
    right_spaces = missing_chars;
  } else if (conv.has_zero_flag()) {
    zeros = missing_chars;
  } else {
    left_spaces = missing_chars;
  }

  sink->Append(left_spaces, ' ');
  if (sign_char != '\0') sink->Append(1, sign_char);
  sink->Append(zeros, '0');
  sink->Append(str);
  sink->Append(right_spaces, ' ');
}